

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

lyxp_set * set_copy(lyxp_set *set)

{
  lyxp_set_type lVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  lyxp_set_type lVar9;
  undefined4 uVar10;
  int iVar11;
  lyxp_set *set_00;
  lyxp_set_node *plVar12;
  hash_table *phVar13;
  char *pcVar14;
  ushort uVar15;
  
  set_00 = (lyxp_set *)malloc(0x40);
  if (set_00 == (lyxp_set *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","set_copy");
    return (lyxp_set *)0x0;
  }
  lVar1 = set->type;
  if (lVar1 == LYXP_SET_NODE_SET) {
    set_00->type = LYXP_SET_NODE_SET;
    uVar2 = set->used;
    plVar12 = (lyxp_set_node *)malloc((ulong)uVar2 << 4);
    (set_00->val).nodes = plVar12;
    if (plVar12 != (lyxp_set_node *)0x0) {
      memcpy(plVar12,(set->val).nodes,(ulong)uVar2 << 4);
      set_00->size = uVar2;
      set_00->used = uVar2;
      set_00->ctx_pos = set->ctx_pos;
      set_00->ctx_size = set->ctx_size;
      phVar13 = lyht_dup(set->ht);
      set_00->ht = phVar13;
      return set_00;
    }
  }
  else {
    if (lVar1 == LYXP_SET_SNODE_SET) {
      *(undefined8 *)set_00 = 0;
      *(undefined8 *)&set_00->field_0x8 = 0;
      set_00->ctx_pos = 0;
      set_00->ctx_size = 0;
      *(undefined8 *)&set_00->field_0x38 = 0;
      set_00->used = 0;
      set_00->size = 0;
      set_00->ht = (hash_table *)0x0;
      (set_00->val).nodes = (lyxp_set_node *)0x0;
      *(undefined8 *)((long)&set_00->val + 8) = 0;
      set_00->type = LYXP_SET_SNODE_SET;
      if (set->used == 0) {
        return set_00;
      }
      uVar15 = 0;
      while( true ) {
        if (((set->val).nodes[uVar15].pos == 1) &&
           (plVar12 = (set->val).nodes + uVar15,
           iVar11 = set_snode_insert_node(set_00,(lys_node *)plVar12->node,plVar12->type),
           iVar11 != 0)) break;
        uVar15 = uVar15 + 1;
        if (set->used <= (uint)uVar15) {
          return set_00;
        }
      }
      set_free_content(set_00);
      goto LAB_00180108;
    }
    lVar9 = set->type;
    uVar10 = *(undefined4 *)&set->field_0x4;
    uVar3 = *(undefined8 *)&set->field_0x8;
    plVar12 = (set->val).nodes;
    uVar4 = *(undefined8 *)((long)&set->val + 8);
    uVar7 = set->used;
    uVar8 = set->size;
    phVar13 = set->ht;
    uVar6 = set->ctx_size;
    uVar5 = *(undefined8 *)&set->field_0x38;
    set_00->ctx_pos = set->ctx_pos;
    set_00->ctx_size = uVar6;
    *(undefined8 *)&set_00->field_0x38 = uVar5;
    set_00->used = uVar7;
    set_00->size = uVar8;
    set_00->ht = phVar13;
    (set_00->val).nodes = plVar12;
    *(undefined8 *)((long)&set_00->val + 8) = uVar4;
    set_00->type = lVar9;
    *(undefined4 *)&set_00->field_0x4 = uVar10;
    *(undefined8 *)&set_00->field_0x8 = uVar3;
    if (lVar1 != LYXP_SET_STRING) {
      return set_00;
    }
    pcVar14 = strdup((set->val).str);
    (set_00->val).str = pcVar14;
    if (pcVar14 != (char *)0x0) {
      return set_00;
    }
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","set_copy");
LAB_00180108:
  free(set_00);
  return (lyxp_set *)0x0;
}

Assistant:

static struct lyxp_set *
set_copy(struct lyxp_set *set)
{
    struct lyxp_set *ret;
    uint16_t i;

    if (!set) {
        return NULL;
    }

    ret = malloc(sizeof *ret);
    LY_CHECK_ERR_RETURN(!ret, LOGMEM(NULL), NULL);

    if (set->type == LYXP_SET_SNODE_SET) {
        memset(ret, 0, sizeof *ret);
        ret->type = set->type;

        for (i = 0; i < set->used; ++i) {
            if (set->val.snodes[i].in_ctx == 1) {
                if (set_snode_insert_node(ret, set->val.snodes[i].snode, set->val.snodes[i].type)) {
                    lyxp_set_free(ret);
                    return NULL;
                }
            }
        }
    } else if (set->type == LYXP_SET_NODE_SET) {
        ret->type = set->type;
        ret->val.nodes = malloc(set->used * sizeof *ret->val.nodes);
        LY_CHECK_ERR_RETURN(!ret->val.nodes, LOGMEM(NULL); free(ret), NULL);
        memcpy(ret->val.nodes, set->val.nodes, set->used * sizeof *ret->val.nodes);

        ret->used = ret->size = set->used;
        ret->ctx_pos = set->ctx_pos;
        ret->ctx_size = set->ctx_size;

#ifdef LY_ENABLED_CACHE
        ret->ht = lyht_dup(set->ht);
#endif
    } else {
       memcpy(ret, set, sizeof *ret);
       if (set->type == LYXP_SET_STRING) {
           ret->val.str = strdup(set->val.str);
           LY_CHECK_ERR_RETURN(!ret->val.str, LOGMEM(NULL); free(ret), NULL);
       }
    }

    return ret;
}